

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O2

Col_Word Col_RopeReplace(Col_Word rope,size_t first,size_t last,Col_Word with)

{
  Col_Word CVar1;
  
  if (last < first) {
    return rope;
  }
  CVar1 = Col_RopeRemove(rope,first,last);
  CVar1 = Col_RopeInsert(CVar1,first,with);
  return CVar1;
}

Assistant:

Col_Word
Col_RopeReplace(
    Col_Word rope,  /*!< Original rope. */
    size_t first,   /*!< Index of first character in range to replace. */
    size_t last,    /*!< Index of last character in range to replace. */
    Col_Word with)  /*!< Replacement rope. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPE,rope} */
    TYPECHECK_ROPE(rope) return WORD_NIL;

    /*! @typecheck{COL_ERROR_ROPE,with} */
    TYPECHECK_ROPE(with) return WORD_NIL;

    /*
     * Quick cases.
     */

    if (first > last) {
        /*
         * No-op.
         */

        return rope;
    }

    /*
     * General case.
     */

    return Col_RopeInsert(Col_RopeRemove(rope, first, last), first, with);
}